

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O1

void match_and_run(Am_Object *cmd_or_inter,Am_Object *match_command)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Wrapper *in_value;
  Am_Am_Slot_Key slot;
  Am_Object script_execute_command;
  Am_Object start_object;
  Am_Object widget;
  Am_Object orig_command;
  Am_Value current_value;
  Am_Value target_value;
  Am_Value_List slots_to_match;
  Am_Value cmd_value;
  Am_Am_Slot_Key local_9a;
  Am_Object *local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Value local_70;
  Am_Value local_60;
  Am_Value_List local_50;
  Am_Value local_40;
  
  local_98 = match_command;
  pAVar2 = Am_Object::Get(match_command,Am_ORIG_COMMAND,0);
  Am_Object::Am_Object(&local_78,pAVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Match command ",0xe);
  poVar3 = operator<<((ostream *)&std::cout,local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," cmd_or_inter ",0xe);
  poVar3 = operator<<(poVar3,cmd_or_inter);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," orig_command ",0xe);
  poVar3 = operator<<(poVar3,&local_78);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ostream::flush();
  pAVar2 = Am_Object::Get(local_98,0xf7,1);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Exiting because recursive\n",0x1a);
    std::ostream::flush();
  }
  else {
    pAVar2 = Am_Object::Get(local_98,0xb8,0);
    Am_Value_List::Am_Value_List(&local_50,pAVar2);
    pAVar2 = Am_Object::Get(cmd_or_inter,0x11a,1);
    Am_Object::Am_Object(&local_88,pAVar2);
    local_9a.value = 0;
    local_60.type = 0;
    local_60.value.wrapper_value = (Am_Wrapper *)0x0;
    local_70.type = 0;
    local_70.value.wrapper_value = (Am_Wrapper *)0x0;
    local_40.type = 0;
    local_40.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Value_List::Start(&local_50);
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_50);
      if (bVar1) break;
      pAVar2 = Am_Value_List::Get(&local_50);
      Am_Am_Slot_Key::operator=(&local_9a,pAVar2);
      pAVar2 = Am_Object::Get(local_98,local_9a.value,1);
      Am_Value::operator=(&local_60,pAVar2);
      Am_Value::operator=(&local_70,&Am_No_Value);
      bVar1 = Am_Value::Valid(&local_60);
      if (bVar1) {
        bVar1 = Am_Object::Valid(&local_88);
        if (bVar1) {
          if (local_9a.value == Am_LOCATION_PLACEHOLDER) {
            Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&local_90,&local_88);
            in_value = Am_Inter_Location::operator_cast_to_Am_Wrapper_
                                 ((Am_Inter_Location *)&local_90);
            Am_Value::operator=(&local_70,in_value);
            Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&local_90);
          }
          else {
            pAVar2 = Am_Object::Get(&local_88,local_9a.value,1);
            Am_Value::operator=(&local_70,pAVar2);
          }
        }
        bVar1 = Am_Value::Valid(&local_70);
        if (!bVar1) {
          pAVar2 = Am_Object::Get(&local_78,local_9a.value,1);
          Am_Value::operator=(&local_70,pAVar2);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Matching slot ",0x10);
      poVar3 = operator<<((ostream *)&std::cout,&local_9a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," target `",9);
      poVar3 = operator<<(poVar3,&local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' cmd value `",0xd);
      poVar3 = operator<<(poVar3,&local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
      std::ostream::flush();
      bVar1 = Am_Value::Valid(&local_60);
      if (bVar1) {
        bVar1 = Am_Value::Valid(&local_70);
        if (bVar1) {
          bVar1 = match_value_or_list(&local_60,&local_70);
          if (!bVar1) goto LAB_002037b5;
        }
      }
      Am_Value_List::Next(&local_50);
    }
    Am_Object::Set(local_98,0xf7,true,1);
    pAVar2 = Am_Object::Get(local_98,Am_SCRIPT_EXECUTE_COMMAND,0);
    Am_Object::Am_Object(&local_90,pAVar2);
    pAVar2 = Am_Object::Get(local_98,Am_WIDGET_FOR_COMMAND,0);
    Am_Object::Am_Object(&local_80,pAVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%% Calling ",0xb);
    poVar3 = operator<<((ostream *)&std::cout,&local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," for widget ",0xc);
    poVar3 = operator<<(poVar3,&local_80);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
    Am_Execute_Command(&local_90,&local_80);
    Am_Object::Set(local_98,0xf7,false,0);
    Am_Object::~Am_Object(&local_80);
    Am_Object::~Am_Object(&local_90);
LAB_002037b5:
    Am_Value::~Am_Value(&local_40);
    Am_Value::~Am_Value(&local_70);
    Am_Value::~Am_Value(&local_60);
    Am_Object::~Am_Object(&local_88);
    Am_Value_List::~Am_Value_List(&local_50);
  }
  Am_Object::~Am_Object(&local_78);
  return;
}

Assistant:

void
match_and_run(Am_Object &cmd_or_inter, Am_Object &match_command)
{
  Am_Object orig_command = match_command.Get(Am_ORIG_COMMAND);
  std::cout << "Match command " << match_command << " cmd_or_inter "
            << cmd_or_inter << " orig_command " << orig_command << std::endl
            << std::flush;
  //check for recursive call
  if (match_command.Peek(Am_RUNNING).Valid()) {
    std::cout << "Exiting because recursive\n" << std::flush;
    return;
  }
  Am_Value_List slots_to_match = match_command.Get(Am_SLOTS_TO_SAVE);
  Am_Object start_object = cmd_or_inter.Peek(Am_START_OBJECT);
  Am_Am_Slot_Key slot;
  Am_Value target_value, current_value, cmd_value;
  for (slots_to_match.Start(); !slots_to_match.Last(); slots_to_match.Next()) {
    slot = slots_to_match.Get();
    target_value = match_command.Peek(slot);
    current_value = Am_No_Value;
    if (target_value.Valid()) {
      if (start_object.Valid()) {
        if (slot == Am_LOCATION_PLACEHOLDER) {
          Am_Inter_Location loc(start_object);
          current_value = loc;
        } else
          current_value = start_object.Peek(slot);
      }
      if (!current_value.Valid())
        current_value = orig_command.Peek(slot);
    }
    std::cout << "  Matching slot " << slot << " target `" << target_value
              << "' cmd value `" << current_value << "'\n"
              << std::flush;
    if (target_value.Valid() && current_value.Valid()) {
      if (!match_value_or_list(target_value, current_value))
        return; //doesn't match
    }
  }

  // if get here, then matches, so execute the script
  match_command.Set(Am_RUNNING, true, Am_OK_IF_NOT_THERE);
  Am_Object script_execute_command =
      match_command.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Object widget = match_command.Get(Am_WIDGET_FOR_COMMAND);
  std::cout << "%% Calling " << script_execute_command << " for widget "
            << widget << std::endl
            << std::flush;
  Am_Execute_Command(script_execute_command, widget);
  match_command.Set(Am_RUNNING, false);
}